

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::WFXMLScanner::scanCDSection(WFXMLScanner *this)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  XMLDocumentHandler *pXVar1;
  XMLSize_t XVar2;
  bool bVar3;
  bool bVar4;
  XMLCh XVar5;
  XMLBuffer *this_02;
  UnexpectedEOFException *this_03;
  Codes toEmit;
  bool bVar6;
  XMLBufBid bbCData;
  XMLCh tmpBuf [9];
  XMLCh local_48 [12];
  
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  bVar3 = ReaderMgr::skippedChar(this_00,L'[');
  if (!bVar3) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedOpenSquareBracket);
    ReaderMgr::skipPastSpaces(this_00);
    bVar3 = ReaderMgr::skippedChar(this_00,L'[');
    if (!bVar3) {
      return;
    }
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  this_02 = XMLBufferMgr::bidOnBuffer(this_01);
  bVar3 = false;
  bVar6 = false;
  do {
    XVar5 = ReaderMgr::getNextChar(this_00);
    if (XVar5 == L'\0') {
      XMLScanner::emitError(&this->super_XMLScanner,UnterminatedCDATASection);
      this_03 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_03,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
                 ,0x696,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_03,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
    }
    if ((XVar5 == L']') &&
       (bVar4 = XMLReader::skippedString((this->super_XMLScanner).fReaderMgr.fCurReader,L"]>"),
       bVar4)) {
      if (bVar3) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      pXVar1 = (this->super_XMLScanner).fDocHandler;
      if (pXVar1 != (XMLDocumentHandler *)0x0) {
        this_02->fBuffer[this_02->fIndex] = L'\0';
        (*pXVar1->_vptr_XMLDocumentHandler[2])();
      }
      bVar4 = false;
    }
    else {
      if (!bVar6) {
        if ((XVar5 & 0xfc00U) == 0xdc00) {
          toEmit = Unexpected2ndSurrogateChar;
          if (!bVar3) {
LAB_002c2485:
            XMLScanner::emitError(&this->super_XMLScanner,toEmit);
          }
        }
        else {
          if ((XVar5 & 0xfc00U) == 0xd800) {
            if (bVar3) {
              XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
            }
            else {
              bVar3 = true;
            }
            goto LAB_002c24e7;
          }
          toEmit = Expected2ndSurrogateChar;
          if (bVar3) goto LAB_002c2485;
          if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)XVar5] &
              0x40) == 0) {
            XMLString::binToText
                      ((uint)(ushort)XVar5,local_48,8,0x10,(this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0);
            bVar6 = true;
          }
        }
        bVar3 = false;
      }
LAB_002c24e7:
      if (this_02->fIndex == this_02->fCapacity) {
        XMLBuffer::ensureCapacity(this_02,1);
      }
      XVar2 = this_02->fIndex;
      this_02->fIndex = XVar2 + 1;
      this_02->fBuffer[XVar2] = XVar5;
      bVar4 = true;
    }
    if (!bVar4) {
      XMLBufferMgr::releaseBuffer(this_01,this_02);
      return;
    }
  } while( true );
}

Assistant:

void WFXMLScanner::scanCDSection()
{
    static const XMLCh CDataClose[] =
    {
            chCloseSquare, chCloseAngle, chNull
    };

    //  The next character should be the opening square bracket. If not
    //  issue an error, but then try to recover by skipping any whitespace
    //  and checking again.
    if (!fReaderMgr.skippedChar(chOpenSquare))
    {
        emitError(XMLErrs::ExpectedOpenSquareBracket);
        fReaderMgr.skipPastSpaces();

        // If we still don't find it, then give up, else keep going
        if (!fReaderMgr.skippedChar(chOpenSquare))
            return;
    }

    // Get a buffer for this
    XMLBufBid bbCData(&fBufMgr);

    //  We just scan forward until we hit the end of CDATA section sequence.
    //  CDATA is effectively a big escape mechanism so we don't treat markup
    //  characters specially here.
    bool            emittedError = false;
    bool    gotLeadingSurrogate = false;
    while (true)
    {
        const XMLCh nextCh = fReaderMgr.getNextChar();

        // Watch for unexpected end of file
        if (!nextCh)
        {
            emitError(XMLErrs::UnterminatedCDATASection);
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        }

        //  If this is a close square bracket it could be our closing
        //  sequence.
        if (nextCh == chCloseSquare && fReaderMgr.skippedString(CDataClose))
        {
            //  make sure we were not expecting a trailing surrogate.
            if (gotLeadingSurrogate)
                emitError(XMLErrs::Expected2ndSurrogateChar);

            // If we have a doc handler, call it
            if (fDocHandler)
            {
                fDocHandler->docCharacters
                (
                    bbCData.getRawBuffer()
                    , bbCData.getLen()
                    , true
                );
            }

            // And we are done
            break;
        }

        //  Make sure its a valid character. But if we've emitted an error
        //  already, don't bother with the overhead since we've already told
        //  them about it.
        if (!emittedError)
        {
            // Deal with surrogate pairs
            if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        emittedError = true;
                    }
                }
                gotLeadingSurrogate = false;
            }
        }

        // Add it to the buffer
        bbCData.append(nextCh);
    }
}